

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O1

int count_extra_by_id(int argc,char **argv)

{
  ushort uVar1;
  zip_flags_t zVar2;
  ulonglong uVar3;
  ulonglong uVar4;
  int iVar5;
  
  iVar5 = 0;
  uVar3 = strtoull(*argv,(char **)0x0,10);
  uVar4 = strtoull(argv[1],(char **)0x0,10);
  zVar2 = get_flags(argv[2]);
  uVar1 = zip_file_extra_fields_count_by_id(za,uVar3,uVar4 & 0xffff,zVar2);
  if ((short)uVar1 < 0) {
    count_extra_by_id_cold_1();
    iVar5 = -1;
  }
  else {
    printf("Extra field count: %d\n",(ulong)uVar1);
  }
  return iVar5;
}

Assistant:

static int
count_extra_by_id(int argc, char *argv[]) {
    zip_int16_t count;
    zip_uint16_t eid;
    zip_flags_t ceflags = 0;
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    eid = (zip_uint16_t)strtoull(argv[1], NULL, 10);
    ceflags = get_flags(argv[2]);
    if ((count = zip_file_extra_fields_count_by_id(za, idx, eid, ceflags)) < 0) {
	fprintf(stderr, "can't get extra field count for file at index '%" PRIu64 "' and for id '%d': %s\n", idx, eid, zip_strerror(za));
	return -1;
    }
    else {
	printf("Extra field count: %d\n", count);
    }
    return 0;
}